

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UCollationResult __thiscall
icu_63::RuleBasedCollator::doCompare
          (RuleBasedCollator *this,UChar *left,int32_t leftLength,UChar *right,int32_t rightLength,
          UErrorCode *errorCode)

{
  int options;
  Normalizer2Impl *nfcImpl_00;
  UBool UVar1;
  UBool UVar2;
  int32_t iVar3;
  bool bVar4;
  undefined1 local_918 [8];
  FCDUTF16NFDIterator rightIter_3;
  FCDUTF16NFDIterator leftIter_3;
  UTF16NFDIterator rightIter_2;
  UTF16NFDIterator leftIter_2;
  Normalizer2Impl *nfcImpl;
  FCDUTF16CollationIterator rightIter_1;
  FCDUTF16CollationIterator leftIter_1;
  undefined1 local_3a0 [8];
  UTF16CollationIterator rightIter;
  UTF16CollationIterator leftIter;
  int32_t fastLatinOptions;
  int32_t result;
  UBool numeric;
  UChar c;
  UChar *pUStack_50;
  int32_t equalPrefixLength;
  UChar *rightLimit;
  UChar *leftLimit;
  UErrorCode *errorCode_local;
  int32_t rightLength_local;
  UChar *right_local;
  int32_t leftLength_local;
  UChar *left_local;
  RuleBasedCollator *this_local;
  
  if ((left == right) && (leftLength == rightLength)) {
    this_local._4_4_ = UCOL_EQUAL;
  }
  else {
    result = 0;
    if (leftLength < 0) {
      rightLimit = (UChar *)0x0;
      pUStack_50 = (UChar *)0x0;
      for (; left[result] == right[result]; result = result + 1) {
        if (left[result] == L'\0') {
          return UCOL_EQUAL;
        }
      }
    }
    else {
      rightLimit = left + leftLength;
      pUStack_50 = right + rightLength;
      for (; result != leftLength; result = result + 1) {
        if ((result == rightLength) || (left[result] != right[result])) goto LAB_002740a4;
      }
      if (result == rightLength) {
        return UCOL_EQUAL;
      }
    }
LAB_002740a4:
    UVar1 = CollationSettings::isNumeric(this->settings);
    if ((0 < result) &&
       (((result != leftLength &&
         (UVar2 = CollationData::isUnsafeBackward(this->data,(uint)(ushort)left[result],UVar1),
         UVar2 != '\0')) ||
        ((result != rightLength &&
         (UVar2 = CollationData::isUnsafeBackward(this->data,(uint)(ushort)right[result],UVar1),
         UVar2 != '\0')))))) {
      do {
        result = result + -1;
        bVar4 = false;
        if (0 < result) {
          UVar2 = CollationData::isUnsafeBackward(this->data,(uint)(ushort)left[result],UVar1);
          bVar4 = UVar2 != '\0';
        }
      } while (bVar4);
    }
    options = this->settings->fastLatinOptions;
    if (((options < 0) || ((result != leftLength && (0x17f < (ushort)left[result])))) ||
       ((result != rightLength && (0x17f < (ushort)right[result])))) {
      leftIter.limit._4_4_ = ~UCOL_GREATER;
    }
    else if (leftLength < 0) {
      leftIter.limit._4_4_ =
           CollationFastLatin::compareUTF16
                     (this->data->fastLatinTable,this->settings->fastLatinPrimaries,options,
                      left + result,-1,right + result,-1);
    }
    else {
      leftIter.limit._4_4_ =
           CollationFastLatin::compareUTF16
                     (this->data->fastLatinTable,this->settings->fastLatinPrimaries,options,
                      left + result,leftLength - result,right + result,rightLength - result);
    }
    if (leftIter.limit._4_4_ == ~UCOL_GREATER) {
      UVar2 = CollationSettings::dontCheckFCD(this->settings);
      if (UVar2 == '\0') {
        FCDUTF16CollationIterator::FCDUTF16CollationIterator
                  ((FCDUTF16CollationIterator *)&rightIter_1.checkDir,this->data,UVar1,left,
                   left + result,rightLimit);
        FCDUTF16CollationIterator::FCDUTF16CollationIterator
                  ((FCDUTF16CollationIterator *)&nfcImpl,this->data,UVar1,right,right + result,
                   pUStack_50);
        leftIter.limit._4_4_ =
             CollationCompare::compareUpToQuaternary
                       ((CollationIterator *)&rightIter_1.checkDir,(CollationIterator *)&nfcImpl,
                        this->settings,errorCode);
        FCDUTF16CollationIterator::~FCDUTF16CollationIterator((FCDUTF16CollationIterator *)&nfcImpl)
        ;
        FCDUTF16CollationIterator::~FCDUTF16CollationIterator
                  ((FCDUTF16CollationIterator *)&rightIter_1.checkDir);
      }
      else {
        UTF16CollationIterator::UTF16CollationIterator
                  ((UTF16CollationIterator *)&rightIter.limit,this->data,UVar1,left,left + result,
                   rightLimit);
        UTF16CollationIterator::UTF16CollationIterator
                  ((UTF16CollationIterator *)local_3a0,this->data,UVar1,right,right + result,
                   pUStack_50);
        leftIter.limit._4_4_ =
             CollationCompare::compareUpToQuaternary
                       ((CollationIterator *)&rightIter.limit,(CollationIterator *)local_3a0,
                        this->settings,errorCode);
        UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)local_3a0);
        UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)&rightIter.limit);
      }
    }
    if (((leftIter.limit._4_4_ == UCOL_EQUAL) &&
        (iVar3 = CollationSettings::getStrength(this->settings), 0xe < iVar3)) &&
       (UVar1 = ::U_FAILURE(*errorCode), UVar1 == '\0')) {
      nfcImpl_00 = this->data->nfcImpl;
      UVar1 = CollationSettings::dontCheckFCD(this->settings);
      if (UVar1 == '\0') {
        anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
                  ((FCDUTF16NFDIterator *)((long)&rightIter_3.str.fUnion + 0x30),nfcImpl_00,
                   left + result,rightLimit);
        anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
                  ((FCDUTF16NFDIterator *)local_918,nfcImpl_00,right + result,pUStack_50);
        this_local._4_4_ =
             anon_unknown_16::compareNFDIter
                       (nfcImpl_00,(NFDIterator *)((long)&rightIter_3.str.fUnion + 0x30),
                        (NFDIterator *)local_918);
        anon_unknown_16::FCDUTF16NFDIterator::~FCDUTF16NFDIterator((FCDUTF16NFDIterator *)local_918)
        ;
        anon_unknown_16::FCDUTF16NFDIterator::~FCDUTF16NFDIterator
                  ((FCDUTF16NFDIterator *)((long)&rightIter_3.str.fUnion + 0x30));
      }
      else {
        anon_unknown_16::UTF16NFDIterator::UTF16NFDIterator
                  ((UTF16NFDIterator *)&rightIter_2.limit,left + result,rightLimit);
        anon_unknown_16::UTF16NFDIterator::UTF16NFDIterator
                  ((UTF16NFDIterator *)((long)&leftIter_3.str.fUnion + 0x30),right + result,
                   pUStack_50);
        this_local._4_4_ =
             anon_unknown_16::compareNFDIter
                       (nfcImpl_00,(NFDIterator *)&rightIter_2.limit,
                        (NFDIterator *)((long)&leftIter_3.str.fUnion + 0x30));
        anon_unknown_16::UTF16NFDIterator::~UTF16NFDIterator
                  ((UTF16NFDIterator *)((long)&leftIter_3.str.fUnion + 0x30));
        anon_unknown_16::UTF16NFDIterator::~UTF16NFDIterator((UTF16NFDIterator *)&rightIter_2.limit)
        ;
      }
    }
    else {
      this_local._4_4_ = leftIter.limit._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

UCollationResult
RuleBasedCollator::doCompare(const UChar *left, int32_t leftLength,
                             const UChar *right, int32_t rightLength,
                             UErrorCode &errorCode) const {
    // U_FAILURE(errorCode) checked by caller.
    if(left == right && leftLength == rightLength) {
        return UCOL_EQUAL;
    }

    // Identical-prefix test.
    const UChar *leftLimit;
    const UChar *rightLimit;
    int32_t equalPrefixLength = 0;
    if(leftLength < 0) {
        leftLimit = NULL;
        rightLimit = NULL;
        UChar c;
        while((c = left[equalPrefixLength]) == right[equalPrefixLength]) {
            if(c == 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }
    } else {
        leftLimit = left + leftLength;
        rightLimit = right + rightLength;
        for(;;) {
            if(equalPrefixLength == leftLength) {
                if(equalPrefixLength == rightLength) { return UCOL_EQUAL; }
                break;
            } else if(equalPrefixLength == rightLength ||
                      left[equalPrefixLength] != right[equalPrefixLength]) {
                break;
            }
            ++equalPrefixLength;
        }
    }

    UBool numeric = settings->isNumeric();
    if(equalPrefixLength > 0) {
        if((equalPrefixLength != leftLength &&
                    data->isUnsafeBackward(left[equalPrefixLength], numeric)) ||
                (equalPrefixLength != rightLength &&
                    data->isUnsafeBackward(right[equalPrefixLength], numeric))) {
            // Identical prefix: Back up to the start of a contraction or reordering sequence.
            while(--equalPrefixLength > 0 &&
                    data->isUnsafeBackward(left[equalPrefixLength], numeric)) {}
        }
        // Notes:
        // - A longer string can compare equal to a prefix of it if only ignorables follow.
        // - With a backward level, a longer string can compare less-than a prefix of it.

        // Pass the actual start of each string into the CollationIterators,
        // plus the equalPrefixLength position,
        // so that prefix matches back into the equal prefix work.
    }

    int32_t result;
    int32_t fastLatinOptions = settings->fastLatinOptions;
    if(fastLatinOptions >= 0 &&
            (equalPrefixLength == leftLength ||
                left[equalPrefixLength] <= CollationFastLatin::LATIN_MAX) &&
            (equalPrefixLength == rightLength ||
                right[equalPrefixLength] <= CollationFastLatin::LATIN_MAX)) {
        if(leftLength >= 0) {
            result = CollationFastLatin::compareUTF16(data->fastLatinTable,
                                                      settings->fastLatinPrimaries,
                                                      fastLatinOptions,
                                                      left + equalPrefixLength,
                                                      leftLength - equalPrefixLength,
                                                      right + equalPrefixLength,
                                                      rightLength - equalPrefixLength);
        } else {
            result = CollationFastLatin::compareUTF16(data->fastLatinTable,
                                                      settings->fastLatinPrimaries,
                                                      fastLatinOptions,
                                                      left + equalPrefixLength, -1,
                                                      right + equalPrefixLength, -1);
        }
    } else {
        result = CollationFastLatin::BAIL_OUT_RESULT;
    }

    if(result == CollationFastLatin::BAIL_OUT_RESULT) {
        if(settings->dontCheckFCD()) {
            UTF16CollationIterator leftIter(data, numeric,
                                            left, left + equalPrefixLength, leftLimit);
            UTF16CollationIterator rightIter(data, numeric,
                                            right, right + equalPrefixLength, rightLimit);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        } else {
            FCDUTF16CollationIterator leftIter(data, numeric,
                                              left, left + equalPrefixLength, leftLimit);
            FCDUTF16CollationIterator rightIter(data, numeric,
                                                right, right + equalPrefixLength, rightLimit);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        }
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return (UCollationResult)result;
    }

    // Note: If NUL-terminated, we could get the actual limits from the iterators now.
    // That would complicate the iterators a bit, NUL-terminated strings are only a C convenience,
    // and the benefit seems unlikely to be measurable.

    // Compare identical level.
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    left += equalPrefixLength;
    right += equalPrefixLength;
    if(settings->dontCheckFCD()) {
        UTF16NFDIterator leftIter(left, leftLimit);
        UTF16NFDIterator rightIter(right, rightLimit);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUTF16NFDIterator leftIter(nfcImpl, left, leftLimit);
        FCDUTF16NFDIterator rightIter(nfcImpl, right, rightLimit);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}